

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void av1_rd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rate,int64_t *dist,
               int do_recon,PC_TREE *pc_tree)

{
  BLOCK_SIZE BVar1;
  RD_STATS best_rd;
  RD_STATS best_rd_00;
  RD_STATS best_rd_01;
  RD_STATS best_rd_02;
  RD_STATS best_rd_03;
  RD_STATS best_rd_04;
  int64_t iVar2;
  PARTITION_TYPE PVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined7 extraout_var;
  PICK_MODE_CONTEXT *pPVar8;
  long lVar9;
  PC_TREE *pPVar10;
  uint uVar11;
  BLOCK_SIZE BVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  int i;
  ulong uVar16;
  int i_4;
  ulong uVar17;
  long lVar18;
  int i_2;
  int iVar19;
  bool bVar20;
  ulong uVar21;
  undefined4 uVar23;
  int *piVar22;
  int64_t *in_stack_fffffffffffffd20;
  undefined4 uVar24;
  undefined8 uVar25;
  RD_STATS local_290;
  ulong local_268;
  ulong local_260;
  long local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  MB_MODE_INFO **local_238;
  int (*local_230) [10];
  ulong local_228;
  TokenExtra **local_220;
  RD_STATS invalid_rdc;
  RD_STATS tmp_rdc;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  local_260 = (ulong)bsize;
  local_268 = CONCAT71(local_268._1_7_,((cpi->common).seq_params)->monochrome == '\0');
  local_250 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [local_260];
  local_238 = mib;
  local_220 = tp;
  if (local_260 < 3) {
    local_258 = 0;
    local_240 = 0;
  }
  else {
    iVar5 = partition_plane_context(&(td->mb).e_mbd,mi_row,mi_col,bsize);
    local_258 = (long)iVar5;
    PVar3 = get_partition(&cpi->common,mi_row,mi_col,bsize);
    local_240 = CONCAT71(extraout_var,PVar3);
  }
  local_248 = local_240 & 0xff;
  BVar4 = get_partition_subsize(bsize,(PARTITION_TYPE)local_240);
  BVar1 = (*local_238)->bsize;
  (td->mb).try_merge_partition = 0;
  pPVar8 = pc_tree->none;
  if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
    pPVar8 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar8;
    if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
      pPVar8 = pc_tree->none;
    }
  }
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  iVar5 = (uint)(byte)local_268 * 2 + 1;
  local_290.rate = 0x7fffffff;
  local_290.zero_rate = 0;
  local_290.dist = 0x7fffffffffffffff;
  local_290.rdcost = 0x7fffffffffffffff;
  local_290.sse = 0x7fffffffffffffff;
  local_290.skip_txfm = '\0';
  none_rdc.rate = 0x7fffffff;
  none_rdc.dist = 0x7fffffffffffffff;
  none_rdc.rdcost = 0x7fffffffffffffff;
  none_rdc.sse = 0x7fffffffffffffff;
  none_rdc.skip_txfm = '\0';
  none_rdc.zero_rate = 0;
  invalid_rdc.rate = 0x7fffffff;
  invalid_rdc.zero_rate = 0;
  invalid_rdc.dist = 0x7fffffffffffffff;
  invalid_rdc.rdcost = 0x7fffffffffffffff;
  invalid_rdc.sse = 0x7fffffffffffffff;
  invalid_rdc.skip_txfm = '\0';
  pc_tree->partitioning = (PARTITION_TYPE)local_240;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar5);
  if ((bsize == BLOCK_16X16) && (cpi->vaq_refresh != 0)) {
    av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BLOCK_16X16);
    iVar6 = av1_log_block_var(cpi,&td->mb,BLOCK_16X16);
    (td->mb).mb_energy = iVar6;
  }
  local_268 = local_250 >> 1 & 0x7fffffff;
  iVar6 = (td->mb).rdmult;
  uVar21 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  bVar13 = 1;
  if ((((byte)local_240 != '\0') && ((cpi->sf).part_sf.partition_search_type == '\x02')) &&
     (iVar7 = (cpi->sf).part_sf.adjust_var_based_rd_partitioning, iVar7 < 3 && iVar7 != 0)) {
    BVar12 = (BLOCK_SIZE)local_260;
    if (BVar12 < BLOCK_32X64) {
LAB_002af15d:
      if (((int)local_268 + mi_row < (cpi->common).mi_params.mi_rows) &&
         (mi_col + (int)local_268 < (cpi->common).mi_params.mi_cols)) {
        (*local_238)->bsize = BVar12;
        pc_tree->partitioning = '\0';
        (td->mb).try_merge_partition = 1;
        best_rd._33_7_ = invalid_rdc._33_7_;
        best_rd.skip_txfm = invalid_rdc.skip_txfm;
        uVar21 = uVar21 & 0xffffffff00000000;
        best_rd.dist._0_4_ = (int)invalid_rdc.dist;
        best_rd.rate = invalid_rdc.rate;
        best_rd.zero_rate = invalid_rdc.zero_rate;
        best_rd.dist._4_4_ = (int)((ulong)invalid_rdc.dist >> 0x20);
        best_rd.rdcost = invalid_rdc.rdcost;
        best_rd.sse = invalid_rdc.sse;
        in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
        pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&none_rdc,'\0',bsize,pPVar8,best_rd);
        bVar20 = true;
        if ((long)none_rdc.rate != 0x7fffffff) {
          lVar9 = (long)(td->mb).mode_costs.partition_cost[local_258][0] + (long)none_rdc.rate;
          none_rdc.rate = (int)lVar9;
          none_rdc.rdcost = none_rdc.dist * 0x80 + ((td->mb).rdmult * lVar9 + 0x100 >> 9);
          bVar20 = none_rdc.rate == 0x7fffffff;
        }
        bVar13 = none_rdc.skip_txfm != '\x01' | bVar20;
        av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar5);
        (*local_238)->bsize = BVar1;
        pc_tree->partitioning = (PARTITION_TYPE)local_240;
      }
    }
    else if (iVar7 == 2) {
      iVar7 = (cpi->common).width;
      iVar19 = (cpi->common).height;
      if (iVar7 < iVar19) {
        iVar19 = iVar7;
      }
      if (((BVar12 == BLOCK_64X64) && (0x167 < iVar19)) &&
         (0xbe < (cpi->common).quant_params.base_qindex)) goto LAB_002af15d;
    }
  }
  local_230 = (int (*) [10])CONCAT71(local_230._1_7_,bVar13);
  local_228 = (ulong)(uint)mi_row;
  for (lVar9 = 0; uVar16 = local_228, lVar9 != 4; lVar9 = lVar9 + 1) {
    pPVar10 = av1_alloc_pc_tree_node(BVar4);
    pc_tree->split[lVar9] = pPVar10;
    if (pPVar10 == (PC_TREE *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE")
      ;
      pPVar10 = pc_tree->split[lVar9];
    }
    pPVar10->index = (int)lVar9;
  }
  if (3 < (byte)local_240) goto LAB_002af63a;
  iVar7 = (int)local_228;
  switch((long)&switchD_002af3a0::switchdataD_00448bf0 +
         (long)(int)(&switchD_002af3a0::switchdataD_00448bf0)[local_248]) {
  case 0x2af3a2:
    best_rd_00._33_7_ = invalid_rdc._33_7_;
    best_rd_00.skip_txfm = invalid_rdc.skip_txfm;
    best_rd_00.dist._0_4_ = (int)invalid_rdc.dist;
    best_rd_00.rate = invalid_rdc.rate;
    best_rd_00.zero_rate = invalid_rdc.zero_rate;
    best_rd_00.dist._4_4_ = (int)((ulong)invalid_rdc.dist >> 0x20);
    best_rd_00.rdcost = invalid_rdc.rdcost;
    best_rd_00.sse = invalid_rdc.sse;
    in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
    pick_sb_modes(cpi,tile_data,&td->mb,iVar7,mi_col,&local_290,'\0',bsize,pPVar8,best_rd_00);
    break;
  case 0x2af401:
    if ((char)local_230 == '\0') goto LAB_002af60d;
    for (lVar9 = 0; uVar16 = local_228, lVar9 != 2; lVar9 = lVar9 + 1) {
      pPVar8 = av1_alloc_pmc(cpi,BVar4,&td->shared_coeff_buf);
      pc_tree->vertical[lVar9] = pPVar8;
      if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
        aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      }
    }
    bVar20 = (byte)local_260 < 3;
    best_rd_02._33_7_ = invalid_rdc._33_7_;
    best_rd_02.skip_txfm = invalid_rdc.skip_txfm;
    uVar23 = (undefined4)(uVar21 >> 0x20);
    iVar7 = (int)local_228;
    best_rd_02.dist._0_4_ = (int)invalid_rdc.dist;
    best_rd_02.rate = invalid_rdc.rate;
    best_rd_02.zero_rate = invalid_rdc.zero_rate;
    best_rd_02.dist._4_4_ = (int)((ulong)invalid_rdc.dist >> 0x20);
    best_rd_02.rdcost = invalid_rdc.rdcost;
    best_rd_02.sse = invalid_rdc.sse;
    in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
    pick_sb_modes(cpi,tile_data,&td->mb,iVar7,mi_col,&local_290,'\x02',BVar4,pc_tree->vertical[0],
                  best_rd_02);
    if (bVar20 || local_290.rate == 0x7fffffff) goto LAB_002af63e;
    iVar19 = (int)local_268 + mi_col;
    if (iVar19 < (cpi->common).mi_params.mi_cols) {
      tmp_rdc.rate = 0;
      tmp_rdc.zero_rate = 0;
      tmp_rdc.dist = 0;
      tmp_rdc.rdcost = 0;
      tmp_rdc.sse = 0;
      tmp_rdc.skip_txfm = '\x01';
      piVar22 = (int *)CONCAT44(uVar23,1);
      av1_update_state(cpi,td,pc_tree->vertical[0],iVar7,mi_col,BVar4,'\x01');
      encode_superblock(cpi,tile_data,td,local_220,'\x01',BVar4,piVar22);
      pPVar8 = pc_tree->vertical[3 < (byte)local_260];
      uVar25 = CONCAT71(invalid_rdc._33_7_,invalid_rdc.skip_txfm);
      uVar23 = (undefined4)invalid_rdc.dist;
      uVar24 = (undefined4)((ulong)invalid_rdc.dist >> 0x20);
      PVar3 = '\x02';
      goto LAB_002afe56;
    }
    break;
  case 0x2af468:
    if ((char)local_230 == '\0') goto LAB_002af60d;
    local_290._0_8_ = local_290._0_8_ & 0xffffffff00000000;
    local_290.dist = 0;
    local_290.rdcost = 0;
    for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
      uVar11 = 0;
      if ((uVar21 & 1) != 0) {
        uVar11 = (uint)local_268;
      }
      iVar19 = ((uint)(uVar21 >> 1) & 0x7fffffff) * (uint)local_268;
      iVar15 = iVar19 + iVar7;
      if ((iVar15 < (cpi->common).mi_params.mi_rows) &&
         ((int)(mi_col + uVar11) < (cpi->common).mi_params.mi_cols)) {
        tmp_rdc._0_8_ = tmp_rdc._0_8_ & 0xffffffff00000000;
        tmp_rdc.sse = 0;
        tmp_rdc.dist = 0;
        tmp_rdc.rdcost = 0;
        in_stack_fffffffffffffd20 = &tmp_rdc.dist;
        av1_rd_use_partition
                  (cpi,td,tile_data,
                   local_238 +
                   (long)iVar19 * (long)(cpi->common).mi_params.mi_stride + (ulong)uVar11,local_220,
                   iVar15,mi_col + uVar11,BVar4,&tmp_rdc.rate,&tmp_rdc.dist,(uint)(uVar21 != 3),
                   pc_tree->split[uVar21]);
        if ((tmp_rdc.rate == 0x7fffffff) || (tmp_rdc.dist == 0x7fffffffffffffff)) goto LAB_002af60d;
        local_290.rate = local_290.rate + tmp_rdc.rate;
        local_290.dist = local_290.dist + tmp_rdc.dist;
      }
    }
    break;
  case 0x2af5aa:
    if ((char)local_230 == '\0') {
LAB_002af60d:
      local_290.rate = 0x7fffffff;
      local_290.zero_rate = 0;
      local_290.dist = 0x7fffffffffffffff;
      local_290.rdcost = 0x7fffffffffffffff;
      local_290.sse = 0x7fffffffffffffff;
      local_290.skip_txfm = '\0';
      break;
    }
    for (lVar9 = 0; uVar16 = local_228, lVar9 != 2; lVar9 = lVar9 + 1) {
      pPVar8 = av1_alloc_pmc(cpi,BVar4,&td->shared_coeff_buf);
      pc_tree->horizontal[lVar9] = pPVar8;
      if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
        aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      }
    }
    bVar20 = 2 < (byte)local_260;
    best_rd_03._33_7_ = invalid_rdc._33_7_;
    best_rd_03.skip_txfm = invalid_rdc.skip_txfm;
    uVar23 = (undefined4)(uVar21 >> 0x20);
    iVar19 = (int)local_228;
    best_rd_03.dist._0_4_ = (int)invalid_rdc.dist;
    best_rd_03.rate = invalid_rdc.rate;
    best_rd_03.zero_rate = invalid_rdc.zero_rate;
    best_rd_03.dist._4_4_ = (int)((ulong)invalid_rdc.dist >> 0x20);
    best_rd_03.rdcost = invalid_rdc.rdcost;
    best_rd_03.sse = invalid_rdc.sse;
    in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
    pick_sb_modes(cpi,tile_data,&td->mb,iVar19,mi_col,&local_290,'\x01',BVar4,pc_tree->horizontal[0]
                  ,best_rd_03);
    if (bVar20 && local_290.rate != 0x7fffffff) {
      iVar7 = (int)local_268 + iVar19;
      if (iVar7 < (cpi->common).mi_params.mi_rows) {
        tmp_rdc.rate = 0;
        tmp_rdc.zero_rate = 0;
        tmp_rdc.dist = 0;
        tmp_rdc.rdcost = 0;
        tmp_rdc.sse = 0;
        tmp_rdc.skip_txfm = '\x01';
        piVar22 = (int *)CONCAT44(uVar23,1);
        av1_update_state(cpi,td,pc_tree->horizontal[0],iVar19,mi_col,BVar4,'\x01');
        encode_superblock(cpi,tile_data,td,local_220,'\x01',BVar4,piVar22);
        pPVar8 = pc_tree->horizontal[1];
        uVar25 = CONCAT71(invalid_rdc._33_7_,invalid_rdc.skip_txfm);
        uVar23 = (undefined4)invalid_rdc.dist;
        uVar24 = (undefined4)((ulong)invalid_rdc.dist >> 0x20);
        PVar3 = '\x01';
        iVar19 = mi_col;
LAB_002afe56:
        best_rd_04.dist._0_4_ = uVar23;
        best_rd_04.rate = invalid_rdc.rate;
        best_rd_04.zero_rate = invalid_rdc.zero_rate;
        best_rd_04.dist._4_4_ = uVar24;
        best_rd_04.rdcost = invalid_rdc.rdcost;
        best_rd_04.sse = invalid_rdc.sse;
        best_rd_04._32_8_ = uVar25;
        in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
        pick_sb_modes(cpi,tile_data,&td->mb,iVar7,iVar19,&tmp_rdc,PVar3,BVar4,pPVar8,best_rd_04);
        if (tmp_rdc.dist == 0x7fffffffffffffff || tmp_rdc.rate == 0x7fffffff) {
          local_290.sse = 0x7fffffffffffffff;
          local_290.skip_txfm = '\0';
          local_290.rate = 0;
          local_290.zero_rate = 0;
          iVar7 = 0x7fffffff;
          local_290.dist = 0x7fffffffffffffff;
          local_290.rdcost = 0x7fffffffffffffff;
        }
        else {
          iVar7 = tmp_rdc.rate + local_290.rate;
          local_290.dist = tmp_rdc.dist + local_290.dist;
          local_290.rdcost = local_290.rdcost + tmp_rdc.rdcost;
        }
        local_290.rate = iVar7;
      }
      break;
    }
    goto LAB_002af63e;
  }
LAB_002af63a:
LAB_002af63e:
  iVar7 = (int)uVar16;
  if (local_290.rate != 0x7fffffff) {
    lVar9 = (long)local_290.rate + (long)(td->mb).mode_costs.partition_cost[local_258][local_248];
    local_290.rate = (int)lVar9;
    local_290.rdcost = local_290.dist * 0x80 + ((td->mb).rdmult * lVar9 + 0x100 >> 9);
  }
  iVar19 = 0x7fffffff;
  BVar4 = (BLOCK_SIZE)local_260;
  if (((((cpi->sf).part_sf.partition_search_type == '\x02') && (BLOCK_8X8 < BVar4)) &&
      ((byte)local_240 != '\x03')) && (2 < (cpi->sf).part_sf.adjust_var_based_rd_partitioning)) {
    iVar15 = (cpi->common).mi_params.mi_rows;
    if (((int)local_268 + iVar7 == iVar15 || (int)local_250 + iVar7 < iVar15) &&
       (iVar15 = (cpi->common).mi_params.mi_cols,
       (int)local_268 + mi_col == iVar15 || (int)local_250 + mi_col < iVar15)) {
      BVar4 = get_partition_subsize(bsize,'\x03');
      av1_restore_context(&td->mb,&x_ctx,iVar7,mi_col,bsize,iVar5);
      lVar9 = local_258;
      pc_tree->partitioning = '\x03';
      local_230 = (td->mb).mode_costs.partition_cost + local_258;
      local_250 = CONCAT44(local_250._4_4_,(uint)BVar4);
      local_248 = 0;
      iVar19 = 0;
      uVar21 = local_268;
      for (uVar17 = 0; iVar7 = (int)uVar16, uVar17 != 4; uVar17 = uVar17 + 1) {
        iVar15 = ((uint)(uVar17 >> 1) & 0x7fffffff) * (int)uVar21 + iVar7;
        if (iVar15 < (cpi->common).mi_params.mi_rows) {
          iVar14 = 0;
          if ((uVar17 & 1) != 0) {
            iVar14 = (int)uVar21;
          }
          iVar14 = iVar14 + mi_col;
          if (iVar14 < (cpi->common).mi_params.mi_cols) {
            local_258 = CONCAT44(local_258._4_4_,iVar19);
            av1_save_context(&td->mb,&x_ctx,iVar7,mi_col,bsize,iVar5);
            pPVar10 = pc_tree->split[uVar17];
            pPVar10->partitioning = '\0';
            pPVar8 = pPVar10->none;
            if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
              pPVar8 = av1_alloc_pmc(cpi,(BLOCK_SIZE)local_250,&td->shared_coeff_buf);
              pc_tree->split[uVar17]->none = pPVar8;
              pPVar8 = pc_tree->split[uVar17]->none;
              if (pPVar8 == (PICK_MODE_CONTEXT *)0x0) {
                aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate PICK_MODE_CONTEXT");
                pPVar8 = pc_tree->split[uVar17]->none;
              }
            }
            best_rd_01._33_7_ = invalid_rdc._33_7_;
            best_rd_01.skip_txfm = invalid_rdc.skip_txfm;
            best_rd_01.dist._0_4_ = (int)invalid_rdc.dist;
            best_rd_01.rate = invalid_rdc.rate;
            best_rd_01.zero_rate = invalid_rdc.zero_rate;
            best_rd_01.dist._4_4_ = (int)((ulong)invalid_rdc.dist >> 0x20);
            best_rd_01.rdcost = invalid_rdc.rdcost;
            best_rd_01.sse = invalid_rdc.sse;
            in_stack_fffffffffffffd20 = (int64_t *)invalid_rdc._0_8_;
            pick_sb_modes(cpi,tile_data,&td->mb,iVar15,iVar14,&tmp_rdc,'\x03',(BLOCK_SIZE)local_250,
                          pPVar8,best_rd_01);
            av1_restore_context(&td->mb,&x_ctx,iVar7,mi_col,bsize,iVar5);
            iVar2 = tmp_rdc.dist;
            iVar7 = tmp_rdc.rate;
            if ((tmp_rdc.rate == 0x7fffffff) || (tmp_rdc.dist == 0x7fffffffffffffff)) {
              lVar9 = 0x7fffffffffffffff;
              iVar7 = (int)local_228;
              BVar4 = (BLOCK_SIZE)local_260;
              iVar19 = 0x7fffffff;
              local_248 = lVar9;
              goto LAB_002afa0f;
            }
            if (uVar17 != 3) {
              encode_sb(cpi,td,tile_data,local_220,iVar15,iVar14,'\0',(BLOCK_SIZE)local_250,
                        pc_tree->split[uVar17],(int *)in_stack_fffffffffffffd20);
            }
            local_248 = local_248 + iVar2;
            iVar19 = iVar7 + (int)local_258 + (*local_230)[0];
            uVar21 = local_268;
            uVar16 = local_228;
          }
        }
      }
      BVar4 = (BLOCK_SIZE)local_260;
      lVar18 = 0x7fffffff;
      if (iVar19 == 0x7fffffff) {
        lVar9 = 0x7fffffffffffffff;
      }
      else {
        lVar18 = (long)iVar19 + (long)(td->mb).mode_costs.partition_cost[lVar9][3];
        lVar9 = local_248 * 0x80 + ((td->mb).rdmult * lVar18 + 0x100 >> 9);
      }
      iVar19 = (int)lVar18;
      goto LAB_002afa0f;
    }
  }
  lVar9 = 0x7fffffffffffffff;
  local_248 = 0x7fffffffffffffff;
LAB_002afa0f:
  if (local_290.rdcost < lVar9) {
    (*local_238)->bsize = BVar1;
    if (BLOCK_8X4 < BVar4) {
      pc_tree->partitioning = (PARTITION_TYPE)local_240;
    }
    lVar9 = local_290.rdcost;
    local_248 = local_290.dist;
    iVar19 = local_290.rate;
  }
  if (((none_rdc.rdcost != 0x7fffffffffffffff) && (none_rdc.rdcost - (none_rdc.rdcost >> 9) < lVar9)
      ) && ((*local_238)->bsize = BVar4, local_248 = none_rdc.dist, iVar19 = none_rdc.rate,
           BLOCK_8X4 < BVar4)) {
    pc_tree->partitioning = '\0';
  }
  av1_restore_context(&td->mb,&x_ctx,iVar7,mi_col,bsize,iVar5);
  if (do_recon != 0) {
    bVar20 = ((cpi->common).seq_params)->sb_size != BVar4;
    if (!bVar20) {
      (td->mb).cb_offset[0] = 0;
      (td->mb).cb_offset[1] = 0;
    }
    encode_sb(cpi,td,tile_data,local_220,iVar7,mi_col,bVar20,bsize,pc_tree,
              (int *)in_stack_fffffffffffffd20);
  }
  *rate = iVar19;
  *dist = local_248;
  (td->mb).rdmult = iVar6;
  return;
}

Assistant:

void av1_rd_use_partition(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                          MB_MODE_INFO **mib, TokenExtra **tp, int mi_row,
                          int mi_col, BLOCK_SIZE bsize, int *rate,
                          int64_t *dist, int do_recon, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS last_part_rdc, none_rdc, chosen_rdc, invalid_rdc;
  BLOCK_SIZE bs_type = mib[0]->bsize;
  int use_partition_none = 0;
  x->try_merge_partition = 0;

  if (pc_tree->none == NULL) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  }
  PICK_MODE_CONTEXT *ctx_none = pc_tree->none;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  // In rt mode, currently the min partition size is BLOCK_8X8.
  assert(bsize >= cpi->sf.part_sf.default_min_partition_size);

  av1_invalid_rd_stats(&last_part_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_invalid_rd_stats(&chosen_rdc);
  av1_invalid_rd_stats(&invalid_rdc);

  pc_tree->partitioning = partition;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh) {
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);
    x->mb_energy = av1_log_block_var(cpi, x, bsize);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  if (partition != PARTITION_NONE &&
      is_adjust_var_based_part_enabled(cm, &cpi->sf.part_sf, bsize) &&
      (mi_row + hbs < mi_params->mi_rows &&
       mi_col + hbs < mi_params->mi_cols)) {
    assert(bsize > cpi->sf.part_sf.default_min_partition_size);
    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    x->try_merge_partition = 1;
    pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &none_rdc, PARTITION_NONE,
                  bsize, ctx_none, invalid_rdc);

    if (none_rdc.rate < INT_MAX) {
      none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
      none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
    }

    // Try to skip split partition evaluation based on none partition
    // characteristics.
    if (none_rdc.rate < INT_MAX && none_rdc.skip_txfm == 1) {
      use_partition_none = 1;
    }

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    mib[0]->bsize = bs_type;
    pc_tree->partitioning = partition;
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
    if (!pc_tree->split[i])
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    pc_tree->split[i]->index = i;
  }
  switch (partition) {
    case PARTITION_NONE:
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_NONE, bsize, ctx_none, invalid_rdc);
      break;
    case PARTITION_HORZ:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->horizontal[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->horizontal[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_HORZ, subsize, pc_tree->horizontal[0],
                    invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_row + hbs < mi_params->mi_rows) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_h = pc_tree->horizontal[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_h, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row + hbs, mi_col, &tmp_rdc,
                      PARTITION_HORZ, subsize, pc_tree->horizontal[1],
                      invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_VERT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->vertical[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->vertical[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_VERT, subsize, pc_tree->vertical[0], invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_col + hbs < mi_params->mi_cols) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_v = pc_tree->vertical[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_v, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row, mi_col + hbs, &tmp_rdc,
                      PARTITION_VERT, subsize,
                      pc_tree->vertical[bsize > BLOCK_8X8], invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_SPLIT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      last_part_rdc.rate = 0;
      last_part_rdc.dist = 0;
      last_part_rdc.rdcost = 0;
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        int jj = i >> 1, ii = i & 0x01;
        RD_STATS tmp_rdc;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;

        av1_init_rd_stats(&tmp_rdc);
        av1_rd_use_partition(
            cpi, td, tile_data,
            mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
            mi_row + y_idx, mi_col + x_idx, subsize, &tmp_rdc.rate,
            &tmp_rdc.dist, i != (SUB_PARTITIONS_SPLIT - 1), pc_tree->split[i]);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }

  if (last_part_rdc.rate < INT_MAX) {
    last_part_rdc.rate += mode_costs->partition_cost[pl][partition];
    last_part_rdc.rdcost =
        RDCOST(x->rdmult, last_part_rdc.rate, last_part_rdc.dist);
  }

  if ((cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION &&
       cpi->sf.part_sf.adjust_var_based_rd_partitioning > 2) &&
      partition != PARTITION_SPLIT && bsize > BLOCK_8X8 &&
      (mi_row + bs < mi_params->mi_rows ||
       mi_row + hbs == mi_params->mi_rows) &&
      (mi_col + bs < mi_params->mi_cols ||
       mi_col + hbs == mi_params->mi_cols)) {
    BLOCK_SIZE split_subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    chosen_rdc.rate = 0;
    chosen_rdc.dist = 0;

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    pc_tree->partitioning = PARTITION_SPLIT;

    // Split partition.
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      RD_STATS tmp_rdc;

      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      pc_tree->split[i]->partitioning = PARTITION_NONE;
      if (pc_tree->split[i]->none == NULL)
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, split_subsize, &td->shared_coeff_buf);
      if (!pc_tree->split[i]->none)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      pick_sb_modes(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx, &tmp_rdc,
                    PARTITION_SPLIT, split_subsize, pc_tree->split[i]->none,
                    invalid_rdc);

      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
        av1_invalid_rd_stats(&chosen_rdc);
        break;
      }

      chosen_rdc.rate += tmp_rdc.rate;
      chosen_rdc.dist += tmp_rdc.dist;

      if (i != SUB_PARTITIONS_SPLIT - 1)
        encode_sb(cpi, td, tile_data, tp, mi_row + y_idx, mi_col + x_idx,
                  OUTPUT_ENABLED, split_subsize, pc_tree->split[i], NULL);

      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
    }
    if (chosen_rdc.rate < INT_MAX) {
      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      chosen_rdc.rdcost = RDCOST(x->rdmult, chosen_rdc.rate, chosen_rdc.dist);
    }
  }

  // If last_part is better set the partitioning to that.
  if (last_part_rdc.rdcost < chosen_rdc.rdcost) {
    mib[0]->bsize = bs_type;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = partition;

    chosen_rdc = last_part_rdc;
  }
  // If none was better set the partitioning to that.
  if (none_rdc.rdcost < INT64_MAX &&
      none_rdc.rdcost - (none_rdc.rdcost >> 9) < chosen_rdc.rdcost) {
    mib[0]->bsize = bsize;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = PARTITION_NONE;
    chosen_rdc = none_rdc;
  }

  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  // We must have chosen a partitioning and encoding or we'll fail later on.
  // No other opportunities for success.
  if (bsize == cm->seq_params->sb_size)
    assert(chosen_rdc.rate < INT_MAX && chosen_rdc.dist < INT64_MAX);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (do_recon) {
    if (bsize == cm->seq_params->sb_size) {
      // NOTE: To get estimate for rate due to the tokens, use:
      // int rate_coeffs = 0;
      // encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_COSTCOEFFS,
      //           bsize, pc_tree, &rate_coeffs);
      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, OUTPUT_ENABLED, bsize,
                pc_tree, NULL);
    } else {
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  *rate = chosen_rdc.rate;
  *dist = chosen_rdc.dist;
  x->rdmult = orig_rdmult;
}